

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O1

void anurbs::NurbsSurfaceGeometry<3l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_00;
  module *this;
  class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
  *pcVar1;
  class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  local_4f0;
  bool local_4e1;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *local_4e0;
  module *local_4d8;
  arg local_4d0;
  arg local_4c0;
  arg local_4b0;
  arg local_4a0;
  arg local_490;
  string name;
  code *local_460;
  undefined8 local_458;
  code *local_450;
  undefined8 local_448;
  arg local_440;
  arg local_430;
  arg local_420;
  arg local_410;
  arg local_400;
  arg_v local_3f0;
  arg local_3b0;
  arg local_3a0;
  code *local_390;
  undefined8 local_388;
  arg local_380;
  arg local_370;
  code *local_360;
  undefined8 local_358;
  arg local_350;
  arg local_340;
  code *local_330;
  undefined8 local_328;
  arg local_320;
  arg local_310;
  code *local_300;
  undefined8 local_2f8;
  arg local_2f0;
  code *local_2e0;
  undefined8 local_2d8;
  arg local_2d0;
  arg local_2c0;
  arg local_2b0;
  arg local_2a0;
  arg local_290;
  code *local_280;
  undefined8 local_278;
  arg local_270;
  arg local_260;
  arg local_250;
  code *local_240;
  undefined8 local_238;
  arg local_230;
  arg local_220;
  code *local_210;
  undefined8 local_208;
  arg local_200;
  code *local_1f0;
  undefined8 local_1e8;
  arg local_1e0;
  code *local_1d0;
  undefined8 local_1c8;
  arg local_1c0;
  code *local_1b0;
  undefined8 local_1a8;
  code *local_1a0;
  undefined8 local_198;
  code *local_190;
  undefined8 local_188;
  code *local_180;
  undefined8 local_178;
  code *local_170;
  undefined8 local_168;
  code *local_160;
  undefined8 local_158;
  code *local_150;
  undefined8 local_148;
  code *local_140;
  undefined8 local_138;
  code *local_130;
  undefined8 local_128;
  code *local_120;
  undefined8 local_118;
  code *local_110;
  undefined8 local_108;
  code *local_100;
  undefined8 local_f8;
  code *local_f0;
  undefined8 local_e8;
  code *local_e0;
  undefined8 local_d8;
  arg local_d0;
  arg local_c0;
  arg local_b0;
  arg local_a0;
  arg local_90;
  arg local_80;
  arg local_70;
  arg local_60;
  arg local_50;
  arg local_40;
  
  python_name_abi_cxx11_();
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  ::class_<>(&local_4f0,(m->super_object).super_handle.m_ptr,name._M_dataplus._M_p);
  local_4a0.name = "degree_u";
  local_4a0._8_1_ = 2;
  local_4b0.name = "degree_v";
  local_4b0._8_1_ = 2;
  local_4c0.name = "nb_poles_u";
  local_4c0._8_1_ = 2;
  local_4d0.name = "nb_poles_v";
  local_4d0._8_1_ = 2;
  local_4e1 = false;
  local_490.name = "is_rational";
  local_490._8_1_ = 2;
  pybind11::arg_v::arg_v<bool>(&local_3f0,&local_490,&local_4e1,(char *)0x0);
  local_4e0 = model;
  local_4d8 = m;
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg_v>
            (&local_4f0,"__init__",(type *)&local_490,(is_new_style_constructor *)&local_400,
             &local_4a0,&local_4b0,&local_4c0,&local_4d0,&local_3f0);
  local_490.name = "degree_u";
  local_490._8_1_ = 2;
  local_400.name = "degree_v";
  local_400._8_1_ = 2;
  local_40.name = "knots_u";
  local_40._8_1_ = 2;
  local_50.name = "knots_v";
  local_50._8_1_ = 2;
  local_60.name = "poles";
  local_60._8_1_ = 2;
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg>
            (&local_4f0,"__init__",(type *)&local_410,(is_new_style_constructor *)&local_420,
             &local_490,&local_400,&local_40,&local_50,&local_60);
  local_410.name = "degree_u";
  local_410._8_1_ = 2;
  local_420.name = "degree_v";
  local_420._8_1_ = 2;
  local_70.name = "knots_u";
  local_70._8_1_ = 2;
  local_80.name = "knots_v";
  local_80._8_1_ = 2;
  local_90.name = "poles";
  local_90._8_1_ = 2;
  local_a0.name = "weights";
  local_a0._8_1_ = 2;
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg>
            (&local_4f0,"__init__",(type *)&local_430,(is_new_style_constructor *)&local_440,
             &local_410,&local_420,&local_70,&local_80,&local_90,&local_a0);
  local_430.name = "degree_u";
  local_430._8_1_ = 2;
  local_440.name = "degree_v";
  local_440._8_1_ = 2;
  local_b0.name = "knots_u";
  local_b0._8_1_ = 2;
  local_c0.name = "knots_v";
  local_c0._8_1_ = 2;
  local_d0.name = "control_points";
  local_d0._8_1_ = 2;
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg>
            (&local_4f0,"__init__",(type *)&local_450,(is_new_style_constructor *)&local_460,
             &local_430,&local_440,&local_b0,&local_c0,&local_d0);
  local_450 = NurbsSurfaceGeometry<3L>::is_rational;
  local_448 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<bool(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        ((class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
                          *)&local_4f0,"is_rational",(offset_in_Model_to_subr *)&local_450);
  local_460 = NurbsSurfaceGeometry<3L>::nb_knots_u;
  local_458 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        (pcVar1,"nb_knots_u",(offset_in_Model_to_subr *)&local_460);
  local_e0 = NurbsSurfaceGeometry<3L>::nb_knots_v;
  local_d8 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        (pcVar1,"nb_knots_v",(offset_in_Model_to_subr *)&local_e0);
  local_f0 = NurbsSurfaceGeometry<3L>::nb_poles;
  local_e8 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        (pcVar1,"nb_poles",(offset_in_Model_to_subr *)&local_f0);
  local_100 = NurbsSurfaceGeometry<3L>::nb_poles_u;
  local_f8 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        (pcVar1,"nb_poles_u",(offset_in_Model_to_subr *)&local_100);
  local_110 = NurbsSurfaceGeometry<3L>::nb_poles_v;
  local_108 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        (pcVar1,"nb_poles_v",(offset_in_Model_to_subr *)&local_110);
  local_120 = NurbsSurfaceGeometry<3L>::knots_u;
  local_118 = 0;
  local_130 = NurbsSurfaceGeometry<3L>::set_knots_u;
  local_128 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(),void(anurbs::NurbsSurfaceGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"knots_u",(offset_in_Model_to_subr *)&local_120,
                         (offset_in_Model_to_subr *)&local_130);
  local_140 = NurbsSurfaceGeometry<3L>::knots_v;
  local_138 = 0;
  local_150 = NurbsSurfaceGeometry<3L>::set_knots_v;
  local_148 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(),void(anurbs::NurbsSurfaceGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"knots_v",(offset_in_Model_to_subr *)&local_140,
                         (offset_in_Model_to_subr *)&local_150);
  local_160 = NurbsSurfaceGeometry<3L>::poles;
  local_158 = 0;
  local_170 = NurbsSurfaceGeometry<3L>::set_poles;
  local_168 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(),void(anurbs::NurbsSurfaceGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>)>
                        (pcVar1,"poles",(offset_in_Model_to_subr *)&local_160,
                         (offset_in_Model_to_subr *)&local_170);
  local_180 = NurbsSurfaceGeometry<3L>::weights;
  local_178 = 0;
  local_190 = NurbsSurfaceGeometry<3L>::set_weights;
  local_188 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(),void(anurbs::NurbsSurfaceGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"weights",(offset_in_Model_to_subr *)&local_180,
                         (offset_in_Model_to_subr *)&local_190);
  local_1a0 = NurbsSurfaceGeometry<3L>::clone;
  local_198 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>(anurbs::NurbsSurfaceGeometry<3l>::*)()>
                        (pcVar1,"clone",(offset_in_Model_to_subr *)&local_1a0);
  local_1b0 = NurbsSurfaceGeometry<3L>::knot_u;
  local_1a8 = 0;
  local_1c0.name = "index";
  local_1c0._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def<double&(anurbs::NurbsSurfaceGeometry<3l>::*)(long),pybind11::arg>
                        (pcVar1,"knot_u",(offset_in_Model_to_subr *)&local_1b0,&local_1c0);
  local_1d0 = NurbsSurfaceGeometry<3L>::knot_v;
  local_1c8 = 0;
  local_1e0.name = "index";
  local_1e0._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def<double&(anurbs::NurbsSurfaceGeometry<3l>::*)(long),pybind11::arg>
                        (pcVar1,"knot_v",(offset_in_Model_to_subr *)&local_1d0,&local_1e0);
  local_1f0 = NurbsSurfaceGeometry<3L>::pole;
  local_1e8 = 0;
  local_200.name = "index";
  local_200._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<Eigen::Matrix<double,1,3,1,1,3>(anurbs::NurbsSurfaceGeometry<3l>::*)(long)const,pybind11::arg>
                        (pcVar1,"pole",(offset_in_Model_to_subr *)&local_1f0,&local_200);
  local_210 = NurbsSurfaceGeometry<3L>::pole;
  local_208 = 0;
  local_220.name = "index_u";
  local_220._8_1_ = 2;
  local_230.name = "index_v";
  local_230._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<Eigen::Matrix<double,1,3,1,1,3>(anurbs::NurbsSurfaceGeometry<3l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"pole",(offset_in_Model_to_subr *)&local_210,&local_220,&local_230);
  local_240 = NurbsSurfaceGeometry<3L>::shape_functions_at;
  local_238 = 0;
  local_250.name = "u";
  local_250._8_1_ = 2;
  local_260.name = "v";
  local_260._8_1_ = 2;
  local_270.name = "order";
  local_270._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(double,double,long)const,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,"shape_functions_at",(offset_in_Model_to_subr *)&local_240,
                         &local_250,&local_260,&local_270);
  local_280 = NurbsSurfaceGeometry<3L>::shape_functions_at_span;
  local_278 = 0;
  local_290.name = "u";
  local_290._8_1_ = 2;
  local_2a0.name = "v";
  local_2a0._8_1_ = 2;
  local_2b0.name = "span_u";
  local_2b0._8_1_ = 2;
  local_2c0.name = "span_v";
  local_2c0._8_1_ = 2;
  local_2d0.name = "order";
  local_2d0._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(double,double,long,long,long)const,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,"shape_functions_at_span",(offset_in_Model_to_subr *)&local_280,
                         &local_290,&local_2a0,&local_2b0,&local_2c0,&local_2d0);
  local_2e0 = NurbsSurfaceGeometry<3L>::weight;
  local_2d8 = 0;
  local_2f0.name = "index";
  local_2f0._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def<double(anurbs::NurbsSurfaceGeometry<3l>::*)(long)const,pybind11::arg>
                        (pcVar1,"weight",(offset_in_Model_to_subr *)&local_2e0,&local_2f0);
  local_300 = NurbsSurfaceGeometry<3L>::weight;
  local_2f8 = 0;
  local_310.name = "index_u";
  local_310._8_1_ = 2;
  local_320.name = "index_v";
  local_320._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<double(anurbs::NurbsSurfaceGeometry<3l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"weight",(offset_in_Model_to_subr *)&local_300,&local_310,&local_320
                        );
  local_330 = NurbsSurfaceGeometry<3L>::greville_point;
  local_328 = 0;
  local_340.name = "index_u";
  local_340._8_1_ = 2;
  local_350.name = "index_v";
  local_350._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<std::pair<double,double>(anurbs::NurbsSurfaceGeometry<3l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"greville_point",(offset_in_Model_to_subr *)&local_330,&local_340,
                         &local_350);
  local_360 = NurbsSurfaceGeometry<3L>::nonzero_pole_indices_at_span;
  local_358 = 0;
  local_370.name = "span_u";
  local_370._8_1_ = 2;
  local_380.name = "span_v";
  local_380._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<std::vector<long,std::allocator<long>>(anurbs::NurbsSurfaceGeometry<3l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"nonzero_pole_indices_at_span",(offset_in_Model_to_subr *)&local_360
                         ,&local_370,&local_380);
  this = local_4d8;
  local_390 = NurbsSurfaceGeometry<3L>::span_at;
  local_388 = 0;
  local_3a0.name = "u";
  local_3a0._8_1_ = 2;
  local_3b0.name = "v";
  local_3b0._8_1_ = 2;
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
  ::
  def<std::pair<long,long>(anurbs::NurbsSurfaceGeometry<3l>::*)(double,double)const,pybind11::arg,pybind11::arg>
            (pcVar1,"span_at",(offset_in_Model_to_subr *)&local_390,&local_3a0,&local_3b0);
  model_00 = local_4e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.type._M_dataplus._M_p != &local_3f0.type.field_2) {
    operator_delete(local_3f0.type._M_dataplus._M_p,local_3f0.type.field_2._M_allocated_capacity + 1
                   );
  }
  pybind11::object::~object(&local_3f0.value);
  pybind11::object::~object((object *)&local_4f0);
  pybind11::module::
  def<anurbs::NurbsSurfaceGeometry<3l>::register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>(pybind11::module&,pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>&)::_lambda(anurbs::Model&,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>)_1_>
            (this,"add",(type *)&local_3f0);
  Model::register_python_data_type<anurbs::NurbsSurfaceGeometry<3l>>(this,model_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = NurbsSurfaceGeometry<TDimension>;
        using Base = SurfaceBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            // constructors
            .def(py::init<const Index, const Index, const Index, const Index, const bool>(), "degree_u"_a, "degree_v"_a, "nb_poles_u"_a, "nb_poles_v"_a, "is_rational"_a = false)
            .def(py::init<const Index, const Index, const Eigen::VectorXd, const Eigen::VectorXd, const Poles>(), "degree_u"_a, "degree_v"_a, "knots_u"_a, "knots_v"_a, "poles"_a)
            .def(py::init<const Index, const Index, const Eigen::VectorXd, const Eigen::VectorXd, const Poles, const Eigen::VectorXd>(), "degree_u"_a, "degree_v"_a, "knots_u"_a, "knots_v"_a, "poles"_a, "weights"_a)
            .def(py::init<const Index, const Index, const Eigen::VectorXd, const Eigen::VectorXd, const std::vector<ControlPoint>>(), "degree_u"_a, "degree_v"_a, "knots_u"_a, "knots_v"_a, "control_points"_a)
            // read-only properties
            .def_property_readonly("is_rational", &Type::is_rational)
            .def_property_readonly("nb_knots_u", &Type::nb_knots_u)
            .def_property_readonly("nb_knots_v", &Type::nb_knots_v)
            .def_property_readonly("nb_poles", &Type::nb_poles)
            .def_property_readonly("nb_poles_u", &Type::nb_poles_u)
            .def_property_readonly("nb_poles_v", &Type::nb_poles_v)
            // properties
            .def_property("knots_u", py::overload_cast<>(&Type::knots_u), &Type::set_knots_u)
            .def_property("knots_v", py::overload_cast<>(&Type::knots_v), &Type::set_knots_v)
            .def_property("poles", py::overload_cast<>(&Type::poles), &Type::set_poles)
            .def_property("weights", py::overload_cast<>(&Type::weights), &Type::set_weights)
            // methods
            .def("clone", &Type::clone)
            .def("knot_u", py::overload_cast<Index>(&Type::knot_u), "index"_a)
            .def("knot_v", py::overload_cast<Index>(&Type::knot_v), "index"_a)
            .def("pole", (Vector(Type::*)(const Index) const) & Type::pole, "index"_a)
            .def("pole", (Vector(Type::*)(const Index, const Index) const) & Type::pole, "index_u"_a, "index_v"_a)
            .def("shape_functions_at", &Type::shape_functions_at, "u"_a, "v"_a, "order"_a)
            .def("shape_functions_at_span", &Type::shape_functions_at_span, "u"_a, "v"_a, "span_u"_a, "span_v"_a, "order"_a)
            .def("weight", (double (Type::*)(const Index) const) & Type::weight, "index"_a)
            .def("weight", (double (Type::*)(const Index, const Index) const) & Type::weight, "index_u"_a, "index_v"_a)
            .def("greville_point", &Type::greville_point, "index_u"_a, "index_v"_a)
            .def("nonzero_pole_indices_at_span", &Type::nonzero_pole_indices_at_span, "span_u"_a, "span_v"_a)
            .def("span_at", &Type::span_at, "u"_a, "v"_a);

        m.def("add", [](Model& model, Holder data) { model.add<Type>(data); });

        Model::register_python_data_type<Type>(m, model);
    }